

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP4Deserializer::ParseMetadataIndex
          (BP4Deserializer *this,BufferSTL *bufferSTL,size_t absoluteStartPos,bool hasHeader,
          bool oneStepOnly)

{
  size_t *psVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  long *plVar8;
  ulong uVar9;
  pointer pcVar10;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *this_01;
  undefined7 in_register_00000009;
  long *plVar11;
  size_type *psVar12;
  uint __val;
  uint uVar13;
  undefined7 in_register_00000081;
  uint __len;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ptrs;
  uint64_t currentTimeStamp;
  uint64_t currentStep;
  uint64_t mpiRank;
  string __str;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined4 local_94;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000081,oneStepOnly);
  pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000009,hasHeader) == 0) {
    uVar9 = (bufferSTL->super_Buffer).m_Position;
  }
  else {
    (bufferSTL->super_Buffer).m_Position = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_Minifooter,0,(char *)(this->m_Minifooter).VersionTag._M_string_length
               ,(ulong)pcVar10);
    (bufferSTL->super_Buffer).m_Position = 0x24;
    cVar2 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[0x24];
    (bufferSTL->super_Buffer).m_Position = 0x25;
    (this->m_Minifooter).IsLittleEndian = cVar2 == '\0';
    bVar7 = helper::IsLittleEndian();
    if ((this->m_Minifooter).IsLittleEndian != bVar7) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Toolkit","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"format::bp::BP4Deserializer","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ParseMetadataIndex","");
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
                 ,"");
      helper::Throw<std::runtime_error>(&local_f8,&local_b8,&local_90,&local_d8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
    }
    (this->m_Minifooter).HasSubFiles = true;
    (bufferSTL->super_Buffer).m_Position = 0x20;
    pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    cVar2 = pcVar10[0x20];
    (this->m_Minifooter).ADIOSVersionMajor = cVar2 - 0x30U;
    (bufferSTL->super_Buffer).m_Position = 0x21;
    cVar3 = pcVar10[0x21];
    (this->m_Minifooter).ADIOSVersionMinor = cVar3 - 0x30U;
    (bufferSTL->super_Buffer).m_Position = 0x22;
    cVar4 = pcVar10[0x22];
    (this->m_Minifooter).ADIOSVersionPatch = cVar4 - 0x30U;
    (this->m_Minifooter).ADIOSVersion =
         (uint)(byte)(cVar4 - 0x30U) +
         (uint)(byte)(cVar3 - 0x30U) * 1000 + (uint)(byte)(cVar2 - 0x30U) * 1000000;
    (bufferSTL->super_Buffer).m_Position = 0x25;
    cVar2 = pcVar10[0x25];
    (bufferSTL->super_Buffer).m_Position = 0x26;
    (this->m_Minifooter).Version = cVar2;
    if (cVar2 != '\x04') {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Toolkit","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"format::bp::BP4Deserializer","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"ParseMetadataIndex","");
      cVar2 = (this->m_Minifooter).Version;
      uVar13 = (uint)cVar2;
      __val = -uVar13;
      if (0 < (int)uVar13) {
        __val = uVar13;
      }
      __len = 1;
      if (9 < __val) {
        __len = 3 - (__val < 100);
      }
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (cVar2 >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (uVar13 >> 0x1f),__len,__val);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x74be7f);
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_40 = *plVar11;
        lStack_38 = plVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar11;
        local_50 = (long *)*plVar8;
      }
      local_48 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_d8.field_2._M_allocated_capacity = *psVar12;
        local_d8.field_2._8_8_ = plVar8[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar12;
        local_d8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      helper::Throw<std::runtime_error>(&local_f8,&local_b8,&local_90,&local_d8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    (bufferSTL->super_Buffer).m_Position = 0x26;
    this->m_WriterIsActive = pcVar10[0x26] == '\x01';
    (bufferSTL->super_Buffer).m_Position = 0x40;
    uVar9 = 0x40;
  }
  while( true ) {
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_b8._M_dataplus._M_p = *(pointer *)(pcVar10 + uVar9);
    (bufferSTL->super_Buffer).m_Position = uVar9 + 8;
    local_90._M_dataplus._M_p = *(pointer *)(pcVar10 + uVar9 + 8);
    (bufferSTL->super_Buffer).m_Position = uVar9 + 0x10;
    lVar5 = *(long *)(pcVar10 + uVar9 + 0x10);
    (bufferSTL->super_Buffer).m_Position = uVar9 + 0x18;
    local_d8._M_dataplus._M_p = (pointer)(lVar5 - absoluteStartPos);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,(iterator)0x0,
               (unsigned_long *)&local_d8);
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar5 = *(long *)(pcVar10 + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_d8._M_dataplus._M_p = (pointer)(lVar5 - absoluteStartPos);
    if (local_f8._M_string_length == local_f8.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,
                 (iterator)local_f8._M_string_length,(unsigned_long *)&local_d8);
      pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      *(pointer *)local_f8._M_string_length = local_d8._M_dataplus._M_p;
      local_f8._M_string_length = local_f8._M_string_length + 8;
    }
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar5 = *(long *)(pcVar10 + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_d8._M_dataplus._M_p = (pointer)(lVar5 - absoluteStartPos);
    if (local_f8._M_string_length == local_f8.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,
                 (iterator)local_f8._M_string_length,(unsigned_long *)&local_d8);
      pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      *(pointer *)local_f8._M_string_length = local_d8._M_dataplus._M_p;
      local_f8._M_string_length = local_f8._M_string_length + 8;
    }
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar5 = *(long *)(pcVar10 + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_d8._M_dataplus._M_p = (pointer)(lVar5 - absoluteStartPos);
    if (local_f8._M_string_length == local_f8.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,
                 (iterator)local_f8._M_string_length,(unsigned_long *)&local_d8);
      pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      *(pointer *)local_f8._M_string_length = local_d8._M_dataplus._M_p;
      local_f8._M_string_length = local_f8._M_string_length + 8;
    }
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    local_d8._M_dataplus._M_p = *(pointer *)(pcVar10 + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    if (local_f8._M_string_length == local_f8.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_f8,
                 (iterator)local_f8._M_string_length,(unsigned_long *)&local_d8);
    }
    else {
      *(pointer *)local_f8._M_string_length = local_d8._M_dataplus._M_p;
      local_f8._M_string_length = local_f8._M_string_length + 8;
    }
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(this->_vptr_BP4Deserializer[-3] +
                                 (long)&(this->m_Minifooter).VersionTag),(key_type *)&local_90);
    this_01 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_00,(key_type *)&local_b8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (this_01,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8);
    psVar1 = &(bufferSTL->super_Buffer).m_Position;
    *psVar1 = *psVar1 + 8;
    if (local_f8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((char)local_94 != '\0') break;
    uVar9 = (bufferSTL->super_Buffer).m_Position;
    pcVar10 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar10) <= uVar9) {
      return;
    }
  }
  return;
}

Assistant:

void BP4Deserializer::ParseMetadataIndex(BufferSTL &bufferSTL, const size_t absoluteStartPos,
                                         const bool hasHeader, const bool oneStepOnly)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (hasHeader)
    {
        // Read header (64 bytes)
        // long version string
        position = m_VersionTagPosition;
        m_Minifooter.VersionTag.assign(&buffer[position], m_VersionTagLength);

        position = m_EndianFlagPosition;
        const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
        m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
        if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
        {
            helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Deserializer",
                                              "ParseMetadataIndex",
                                              "reader found BigEndian bp file, "
                                              "this version of ADIOS2 wasn't compiled "
                                              "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                              "explicitly, in call to Open");
        }
#endif

        // This has no flag in BP4 header. Always true
        m_Minifooter.HasSubFiles = true;

        // Writer's ADIOS version
        position = m_VersionMajorPosition;
        uint8_t ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMajor = ascii - (uint8_t)'0';
        position = m_VersionMinorPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMinor = ascii - (uint8_t)'0';
        position = m_VersionPatchPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionPatch = ascii - (uint8_t)'0';
        m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                    m_Minifooter.ADIOSVersionMinor * 1000 +
                                    m_Minifooter.ADIOSVersionPatch;

        // BP version
        position = m_BPVersionPosition;
        m_Minifooter.Version =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        if (m_Minifooter.Version != 4)
        {
            helper::Throw<std::runtime_error>(
                "Toolkit", "format::bp::BP4Deserializer", "ParseMetadataIndex",
                "ADIOS2 BP4 Engine only supports bp format "
                "version 4, found " +
                    std::to_string(m_Minifooter.Version) + " version");
        }

        // Writer active flag
        position = m_ActiveFlagPosition;
        const char activeChar =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_WriterIsActive = (activeChar == '\1' ? true : false);

        // move position to first row
        position = 64;
    }

    // Read each record now
    do
    {
        std::vector<uint64_t> ptrs;
        const uint64_t currentStep =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t mpiRank =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t pgIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(pgIndexStart - absoluteStartPos);
        const uint64_t variablesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(variablesIndexStart - absoluteStartPos);
        const uint64_t attributesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(attributesIndexStart - absoluteStartPos);
        const uint64_t currentStepEndPos =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentStepEndPos - absoluteStartPos);
        const uint64_t currentTimeStamp =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentTimeStamp);
        m_MetadataIndexTable[mpiRank][currentStep] = ptrs;
        position += 8;
    } while (!oneStepOnly && position < buffer.size());
}